

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_functions_shouldnt_crash_with_null_pointers(void)

{
  long lVar1;
  cJSON_bool cVar2;
  cJSON *object;
  cJSON *pcVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  char buffer [10];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  object = cJSON_CreateString("item");
  global_hooks.allocate = malloc;
  global_hooks.deallocate = free;
  global_hooks.reallocate = realloc;
  pcVar3 = cJSON_Parse((char *)0x0);
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x163);
  }
  global_error_0 = 0;
  global_error_1 = 0;
  pcVar4 = cJSON_Print((cJSON *)0x0);
  if (pcVar4 != (char *)0x0) {
    UnityFail(" Expected NULL",0x165);
  }
  pcVar4 = cJSON_PrintUnformatted((cJSON *)0x0);
  if (pcVar4 != (char *)0x0) {
    UnityFail(" Expected NULL",0x166);
  }
  pcVar4 = cJSON_PrintBuffered((cJSON *)0x0,10,1);
  if (pcVar4 != (char *)0x0) {
    UnityFail(" Expected NULL",0x167);
  }
  cVar2 = cJSON_PrintPreallocated((cJSON *)0x0,buffer,10,1);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x168);
  }
  cJSON_Delete((cJSON *)0x0);
  pcVar3 = cJSON_GetObjectItem((cJSON *)0x0,"item");
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x16d);
  }
  pcVar3 = cJSON_GetObjectItem(object,(char *)0x0);
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x16e);
  }
  pcVar3 = cJSON_GetObjectItemCaseSensitive((cJSON *)0x0,"item");
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x16f);
  }
  pcVar3 = cJSON_GetObjectItemCaseSensitive(object,(char *)0x0);
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x170);
  }
  cVar2 = cJSON_HasObjectItem((cJSON *)0x0,"item");
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x171);
  }
  cVar2 = cJSON_HasObjectItem(object,(char *)0x0);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x172);
  }
  pcVar3 = cJSON_CreateString((char *)0x0);
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x17d);
  }
  pcVar3 = cJSON_CreateRaw((char *)0x0);
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x17e);
  }
  cJSON_AddItemToObject(object,"item",(cJSON *)0x0);
  cJSON_AddItemToObject(object,(char *)0x0,object);
  cJSON_AddItemToObject((cJSON *)0x0,"item",object);
  cJSON_AddItemToObjectCS(object,"item",(cJSON *)0x0);
  cJSON_AddItemToObjectCS(object,(char *)0x0,object);
  cJSON_AddItemToObjectCS((cJSON *)0x0,"item",object);
  cJSON_AddItemReferenceToArray(object,(cJSON *)0x0);
  cJSON_AddItemReferenceToObject(object,"item",(cJSON *)0x0);
  pcVar3 = cJSON_DetachItemFromArray((cJSON *)0x0,0);
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x192);
  }
  cJSON_DeleteItemFromArray((cJSON *)0x0,0);
  pcVar3 = cJSON_DetachItemFromObject((cJSON *)0x0,"item");
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x194);
  }
  pcVar3 = cJSON_DetachItemFromObject(object,(char *)0x0);
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x195);
  }
  pcVar3 = cJSON_DetachItemFromObjectCaseSensitive((cJSON *)0x0,"item");
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x196);
  }
  pcVar3 = cJSON_DetachItemFromObjectCaseSensitive(object,(char *)0x0);
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x197);
  }
  cJSON_DeleteItemFromObject((cJSON *)0x0,"item");
  cJSON_DeleteItemFromObject(object,(char *)0x0);
  cJSON_DeleteItemFromObjectCaseSensitive((cJSON *)0x0,"item");
  cJSON_DeleteItemFromObjectCaseSensitive(object,(char *)0x0);
  cJSON_InsertItemInArray((cJSON *)0x0,0,object);
  cJSON_InsertItemInArray(object,0,(cJSON *)0x0);
  cJSON_ReplaceItemInArray(object,0,(cJSON *)0x0);
  cJSON_ReplaceItemInArray((cJSON *)0x0,0,object);
  cJSON_ReplaceItemInObject((cJSON *)0x0,"item",object);
  cJSON_ReplaceItemInObject(object,(char *)0x0,object);
  cJSON_ReplaceItemInObject(object,"item",(cJSON *)0x0);
  cJSON_ReplaceItemInObjectCaseSensitive((cJSON *)0x0,"item",object);
  cJSON_ReplaceItemInObjectCaseSensitive(object,(char *)0x0,object);
  cJSON_ReplaceItemInObjectCaseSensitive(object,"item",(cJSON *)0x0);
  cVar2 = cJSON_Compare(object,(cJSON *)0x0,0);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x1aa);
  }
  cVar2 = cJSON_Compare((cJSON *)0x0,object,0);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x1ab);
  }
  cJSON_Delete(object);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_functions_shouldnt_crash_with_null_pointers(void)
{
    char buffer[10];
    cJSON *item = cJSON_CreateString("item");

    cJSON_InitHooks(NULL);
    TEST_ASSERT_NULL(cJSON_Parse(NULL));
    TEST_ASSERT_NULL(cJSON_ParseWithOpts(NULL, NULL, true));
    TEST_ASSERT_NULL(cJSON_Print(NULL));
    TEST_ASSERT_NULL(cJSON_PrintUnformatted(NULL));
    TEST_ASSERT_NULL(cJSON_PrintBuffered(NULL, 10, true));
    TEST_ASSERT_FALSE(cJSON_PrintPreallocated(NULL, buffer, sizeof(buffer), true));
    TEST_ASSERT_FALSE(cJSON_PrintPreallocated(item, NULL, 1, true));
    cJSON_Delete(NULL);
    cJSON_GetArraySize(NULL);
    TEST_ASSERT_NULL(cJSON_GetArrayItem(NULL, 0));
    TEST_ASSERT_NULL(cJSON_GetObjectItem(NULL, "item"));
    TEST_ASSERT_NULL(cJSON_GetObjectItem(item, NULL));
    TEST_ASSERT_NULL(cJSON_GetObjectItemCaseSensitive(NULL, "item"));
    TEST_ASSERT_NULL(cJSON_GetObjectItemCaseSensitive(item, NULL));
    TEST_ASSERT_FALSE(cJSON_HasObjectItem(NULL, "item"));
    TEST_ASSERT_FALSE(cJSON_HasObjectItem(item, NULL));
    TEST_ASSERT_FALSE(cJSON_IsInvalid(NULL));
    TEST_ASSERT_FALSE(cJSON_IsFalse(NULL));
    TEST_ASSERT_FALSE(cJSON_IsTrue(NULL));
    TEST_ASSERT_FALSE(cJSON_IsBool(NULL));
    TEST_ASSERT_FALSE(cJSON_IsNull(NULL));
    TEST_ASSERT_FALSE(cJSON_IsNumber(NULL));
    TEST_ASSERT_FALSE(cJSON_IsString(NULL));
    TEST_ASSERT_FALSE(cJSON_IsArray(NULL));
    TEST_ASSERT_FALSE(cJSON_IsObject(NULL));
    TEST_ASSERT_FALSE(cJSON_IsRaw(NULL));
    TEST_ASSERT_NULL(cJSON_CreateString(NULL));
    TEST_ASSERT_NULL(cJSON_CreateRaw(NULL));
    TEST_ASSERT_NULL(cJSON_CreateIntArray(NULL, 10));
    TEST_ASSERT_NULL(cJSON_CreateFloatArray(NULL, 10));
    TEST_ASSERT_NULL(cJSON_CreateDoubleArray(NULL, 10));
    TEST_ASSERT_NULL(cJSON_CreateStringArray(NULL, 10));
    cJSON_AddItemToArray(NULL, item);
    cJSON_AddItemToArray(item, NULL);
    cJSON_AddItemToObject(item, "item", NULL);
    cJSON_AddItemToObject(item, NULL, item);
    cJSON_AddItemToObject(NULL, "item", item);
    cJSON_AddItemToObjectCS(item, "item", NULL);
    cJSON_AddItemToObjectCS(item, NULL, item);
    cJSON_AddItemToObjectCS(NULL, "item", item);
    cJSON_AddItemReferenceToArray(NULL, item);
    cJSON_AddItemReferenceToArray(item, NULL);
    cJSON_AddItemReferenceToObject(item, "item", NULL);
    cJSON_AddItemReferenceToObject(item, NULL, item);
    cJSON_AddItemReferenceToObject(NULL, "item", item);
    TEST_ASSERT_NULL(cJSON_DetachItemViaPointer(NULL, item));
    TEST_ASSERT_NULL(cJSON_DetachItemViaPointer(item, NULL));
    TEST_ASSERT_NULL(cJSON_DetachItemFromArray(NULL, 0));
    cJSON_DeleteItemFromArray(NULL, 0);
    TEST_ASSERT_NULL(cJSON_DetachItemFromObject(NULL, "item"));
    TEST_ASSERT_NULL(cJSON_DetachItemFromObject(item, NULL));
    TEST_ASSERT_NULL(cJSON_DetachItemFromObjectCaseSensitive(NULL, "item"));
    TEST_ASSERT_NULL(cJSON_DetachItemFromObjectCaseSensitive(item, NULL));
    cJSON_DeleteItemFromObject(NULL, "item");
    cJSON_DeleteItemFromObject(item, NULL);
    cJSON_DeleteItemFromObjectCaseSensitive(NULL, "item");
    cJSON_DeleteItemFromObjectCaseSensitive(item, NULL);
    cJSON_InsertItemInArray(NULL, 0, item);
    cJSON_InsertItemInArray(item, 0, NULL);
    TEST_ASSERT_FALSE(cJSON_ReplaceItemViaPointer(NULL, item, item));
    TEST_ASSERT_FALSE(cJSON_ReplaceItemViaPointer(item, NULL, item));
    TEST_ASSERT_FALSE(cJSON_ReplaceItemViaPointer(item, item, NULL));
    cJSON_ReplaceItemInArray(item, 0, NULL);
    cJSON_ReplaceItemInArray(NULL, 0, item);
    cJSON_ReplaceItemInObject(NULL, "item", item);
    cJSON_ReplaceItemInObject(item, NULL, item);
    cJSON_ReplaceItemInObject(item, "item", NULL);
    cJSON_ReplaceItemInObjectCaseSensitive(NULL, "item", item);
    cJSON_ReplaceItemInObjectCaseSensitive(item, NULL, item);
    cJSON_ReplaceItemInObjectCaseSensitive(item, "item", NULL);
    TEST_ASSERT_NULL(cJSON_Duplicate(NULL, true));
    TEST_ASSERT_FALSE(cJSON_Compare(item, NULL, false));
    TEST_ASSERT_FALSE(cJSON_Compare(NULL, item, false));
    cJSON_Minify(NULL);
    /* skipped because it is only used via a macro that checks for NULL */
    /* cJSON_SetNumberHelper(NULL, 0); */

    cJSON_Delete(item);
}